

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O1

TestCaseGroup *
vkt::SpirVAssembly::anon_unknown_5::createOpSRemComputeGroup
          (TestContext *testCtx,qpTestResult negFailResult)

{
  long *plVar1;
  int *piVar2;
  char *pcVar3;
  deUint32 seed;
  TestNode *pTVar4;
  char *pcVar5;
  long *plVar6;
  undefined8 *puVar7;
  BufferInterface *pBVar8;
  SpvAsmComputeShaderCase *this;
  ulong *puVar9;
  long lVar10;
  ulong uVar11;
  int ndx;
  int numValues;
  long lVar12;
  _func_bool_long *in_R9;
  pointer piVar13;
  bool bVar14;
  vector<int,_std::allocator<int>_> inputInts2;
  vector<int,_std::allocator<int>_> inputInts1;
  vector<int,_std::allocator<int>_> outputInts;
  Random rnd;
  CaseParams cases [2];
  int offset;
  BufferInterface *in_stack_fffffffffffffd88;
  BufferInterface *pBVar15;
  BufferInterface local_268;
  long lStack_260;
  allocator<char> local_252;
  allocator<char> local_251;
  TestNode *local_250;
  vector<int,_std::allocator<int>_> local_248;
  vector<int,_std::allocator<int>_> local_228;
  long *local_208;
  undefined8 local_200;
  long local_1f8;
  undefined8 uStack_1f0;
  vector<int,_std::allocator<int>_> local_1e8;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8;
  long lStack_1b0;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198 [2];
  TestContext *local_188;
  long *local_180 [2];
  long local_170 [2];
  deRandom local_160;
  undefined1 local_150 [64];
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  local_110;
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  local_f8;
  int local_e0 [4];
  pointer local_d0;
  pointer local_c0;
  qpTestResult local_b8;
  _Alloc_hider local_b0;
  char *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  char *local_88 [2];
  qpTestResult local_78 [6];
  char *local_60;
  char *local_58;
  qpTestResult local_50;
  undefined8 local_4c;
  undefined8 uStack_44;
  
  pTVar4 = (TestNode *)operator_new(0x70);
  local_188 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,testCtx,"opsrem","Test the OpSRem instruction");
  seed = deStringHash((pTVar4->m_name)._M_dataplus._M_p);
  deRandom_init(&local_160,seed);
  local_88[0] = "positive";
  local_88[1] = "Output doesn\'t match with expected";
  local_78[0] = QP_TEST_RESULT_FAIL;
  local_78[1] = QP_TEST_RESULT_PASS;
  local_78[2] = 0x10000;
  local_78[3] = QP_TEST_RESULT_PASS;
  local_78[4] = 100;
  local_60 = "all";
  local_58 = "Inconsistent results, but within specification";
  local_4c = 0x10000ffff0000;
  uStack_44 = 0x64ffffff9c;
  lVar10 = 0;
  local_250 = pTVar4;
  local_50 = negFailResult;
  do {
    offset = (int)in_stack_fffffffffffffd88;
    ComputeShaderSpec::ComputeShaderSpec((ComputeShaderSpec *)local_150);
    local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)operator_new(800);
    piVar13 = local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 200;
    local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar13;
    memset(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start,0,800);
    local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar13;
    local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)operator_new(800);
    piVar13 = local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 200;
    local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar13;
    memset(local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start,0,800);
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar13;
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)operator_new(800);
    piVar13 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 200;
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar13;
    memset(local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start,0,800);
    numValues = 200;
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar13;
    fillRandomScalars<int>
              ((Random *)&local_160,local_78[lVar10 * 10 + 1],local_78[lVar10 * 10 + 2],
               local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,200,(int)in_R9);
    SpirVAssembly::(anonymous_namespace)::fillRandomScalars<int,bool(*)(long)>
              ((Random *)&local_160,local_78[lVar10 * 10 + 3],local_78[lVar10 * 10 + 4],
               local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,numValues,in_R9,offset);
    lVar12 = 0;
    do {
      local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar12] =
           local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar12] %
           local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 200);
    pcVar5 = getComputeAsmShaderPreamble();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_180,pcVar5,&local_251);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_180);
    local_1c8 = &local_1b8;
    puVar9 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar9) {
      local_1b8 = *puVar9;
      lStack_1b0 = plVar6[3];
    }
    else {
      local_1b8 = *puVar9;
      local_1c8 = (ulong *)*plVar6;
    }
    local_1c0 = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    pcVar5 = getComputeAsmCommonTypes();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,pcVar5,&local_252);
    uVar11 = 0xf;
    if (local_1c8 != &local_1b8) {
      uVar11 = local_1b8;
    }
    if (uVar11 < (ulong)(local_1a0 + local_1c0)) {
      uVar11 = 0xf;
      if (local_1a8 != local_198) {
        uVar11 = local_198[0];
      }
      if (uVar11 < (ulong)(local_1a0 + local_1c0)) goto LAB_0058faee;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,(ulong)local_1c8);
    }
    else {
LAB_0058faee:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_1a8);
    }
    local_208 = &local_1f8;
    plVar6 = puVar7 + 2;
    if ((long *)*puVar7 == plVar6) {
      local_1f8 = *plVar6;
      uStack_1f0 = puVar7[3];
    }
    else {
      local_1f8 = *plVar6;
      local_208 = (long *)*puVar7;
    }
    local_200 = puVar7[1];
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_208);
    pBVar8 = (BufferInterface *)(plVar6 + 2);
    if ((BufferInterface *)*plVar6 == pBVar8) {
      local_268._vptr_BufferInterface = pBVar8->_vptr_BufferInterface;
      lStack_260 = plVar6[3];
      pBVar15 = &local_268;
    }
    else {
      local_268._vptr_BufferInterface = pBVar8->_vptr_BufferInterface;
      pBVar15 = (BufferInterface *)*plVar6;
    }
    *plVar6 = (long)pBVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_150,(string *)&stack0xfffffffffffffd88);
    if (pBVar15 != &local_268) {
      operator_delete(pBVar15,(long)local_268._vptr_BufferInterface + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_1a8 != local_198) {
      operator_delete(local_1a8,local_198[0] + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,local_1b8 + 1);
    }
    if (local_180[0] != local_170) {
      operator_delete(local_180[0],local_170[0] + 1);
    }
    puVar7 = (undefined8 *)operator_new(0x20);
    *puVar7 = &PTR__Buffer_00d5a018;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(puVar7 + 1),&local_228);
    plVar6 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar6 + 1) = 0;
    *(undefined4 *)((long)plVar6 + 0xc) = 0;
    *plVar6 = (long)&PTR__SharedPtrState_00d59fd8;
    plVar6[2] = (long)puVar7;
    *(undefined4 *)(plVar6 + 1) = 1;
    *(undefined4 *)((long)plVar6 + 0xc) = 1;
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
    ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
              ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                *)&local_110,
               (SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&stack0xfffffffffffffd88);
    if (plVar6 != (long *)0x0) {
      LOCK();
      plVar1 = plVar6 + 1;
      *(int *)plVar1 = (int)*plVar1 + -1;
      UNLOCK();
      if ((int)*plVar1 == 0) {
        (**(code **)(*plVar6 + 0x10))();
      }
      LOCK();
      piVar2 = (int *)((long)plVar6 + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (plVar6 != (long *)0x0)) {
        (**(code **)(*plVar6 + 8))();
      }
    }
    puVar7 = (undefined8 *)operator_new(0x20);
    *puVar7 = &PTR__Buffer_00d5a018;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(puVar7 + 1),&local_248);
    plVar6 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar6 + 1) = 0;
    *(undefined4 *)((long)plVar6 + 0xc) = 0;
    *plVar6 = (long)&PTR__SharedPtrState_00d59fd8;
    plVar6[2] = (long)puVar7;
    *(undefined4 *)(plVar6 + 1) = 1;
    *(undefined4 *)((long)plVar6 + 0xc) = 1;
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
    ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
              ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                *)&local_110,
               (SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&stack0xfffffffffffffd88);
    if (plVar6 != (long *)0x0) {
      LOCK();
      plVar1 = plVar6 + 1;
      *(int *)plVar1 = (int)*plVar1 + -1;
      UNLOCK();
      if ((int)*plVar1 == 0) {
        (**(code **)(*plVar6 + 0x10))();
      }
      LOCK();
      piVar2 = (int *)((long)plVar6 + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (plVar6 != (long *)0x0)) {
        (**(code **)(*plVar6 + 8))();
      }
    }
    pBVar8 = (BufferInterface *)operator_new(0x20);
    pBVar8->_vptr_BufferInterface = (_func_int **)&PTR__Buffer_00d5a018;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)(pBVar8 + 1),&local_1e8);
    in_stack_fffffffffffffd88 = pBVar8;
    plVar6 = (long *)operator_new(0x20);
    *(undefined4 *)(plVar6 + 1) = 0;
    *(undefined4 *)((long)plVar6 + 0xc) = 0;
    *plVar6 = (long)&PTR__SharedPtrState_00d59fd8;
    plVar6[2] = (long)pBVar8;
    *(undefined4 *)(plVar6 + 1) = 1;
    *(undefined4 *)((long)plVar6 + 0xc) = 1;
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
    ::emplace_back<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>
              ((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>>>
                *)&local_f8,
               (SharedPtr<vkt::SpirVAssembly::BufferInterface> *)&stack0xfffffffffffffd88);
    if (plVar6 != (long *)0x0) {
      LOCK();
      plVar1 = plVar6 + 1;
      *(int *)plVar1 = (int)*plVar1 + -1;
      UNLOCK();
      if ((int)*plVar1 == 0) {
        in_stack_fffffffffffffd88 = (BufferInterface *)0x0;
        (**(code **)(*plVar6 + 0x10))();
      }
      LOCK();
      piVar2 = (int *)((long)plVar6 + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (plVar6 != (long *)0x0)) {
        (**(code **)(*plVar6 + 8))();
      }
    }
    pcVar3 = local_a8;
    local_e0[0] = 200;
    local_e0[1] = 1;
    local_e0[2] = 1;
    local_b8 = local_78[lVar10 * 10];
    pcVar5 = local_88[lVar10 * 5 + 1];
    strlen(pcVar5);
    pTVar4 = local_250;
    std::__cxx11::string::_M_replace((ulong)&local_b0,0,pcVar3,(ulong)pcVar5);
    this = (SpvAsmComputeShaderCase *)operator_new(0x140);
    in_R9 = (_func_bool_long *)0x0;
    SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
              (this,local_188,local_88[lVar10 * 5],"",(ComputeShaderSpec *)local_150,
               COMPUTE_TEST_USES_NONE);
    tcu::TestNode::addChild(pTVar4,(TestNode *)this);
    if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_p != &local_a0) {
      operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
    }
    if (local_d0 != (pointer)0x0) {
      operator_delete(local_d0,(long)local_c0 - (long)local_d0);
    }
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::~vector(&local_f8);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::~vector(&local_110);
    if ((undefined1 *)local_150._32_8_ != local_150 + 0x30) {
      operator_delete((void *)local_150._32_8_,local_150._48_8_ + 1);
    }
    if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    bVar14 = lVar10 != 0;
    lVar10 = lVar10 + 1;
    if (bVar14) {
      return (TestCaseGroup *)pTVar4;
    }
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createOpSRemComputeGroup (tcu::TestContext& testCtx, qpTestResult negFailResult)
{
	de::MovePtr<tcu::TestCaseGroup>	group			(new tcu::TestCaseGroup(testCtx, "opsrem", "Test the OpSRem instruction"));
	de::Random						rnd				(deStringHash(group->getName()));
	const int						numElements		= 200;

	const struct CaseParams
	{
		const char*		name;
		const char*		failMessage;		// customized status message
		qpTestResult	failResult;			// override status on failure
		int				op1Min, op1Max;		// operand ranges
		int				op2Min, op2Max;
	} cases[] =
	{
		{ "positive",	"Output doesn't match with expected",				QP_TEST_RESULT_FAIL,	0,		65536,	0,		100 },
		{ "all",		"Inconsistent results, but within specification",	negFailResult,			-65536,	65536,	-100,	100 },	// see below
	};
	// If either operand is negative the result is undefined. Some implementations may still return correct values.

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
	{
		const CaseParams&	params		= cases[caseNdx];
		ComputeShaderSpec	spec;
		vector<deInt32>		inputInts1	(numElements, 0);
		vector<deInt32>		inputInts2	(numElements, 0);
		vector<deInt32>		outputInts	(numElements, 0);

		fillRandomScalars(rnd, params.op1Min, params.op1Max, &inputInts1[0], numElements);
		fillRandomScalars(rnd, params.op2Min, params.op2Max, &inputInts2[0], numElements, filterNotZero);

		for (int ndx = 0; ndx < numElements; ++ndx)
		{
			// The return value of std::fmod() has the same sign as its first operand, which is how OpFRem spec'd.
			outputInts[ndx] = inputInts1[ndx] % inputInts2[ndx];
		}

		spec.assembly =
			string(getComputeAsmShaderPreamble()) +

			"OpName %main           \"main\"\n"
			"OpName %id             \"gl_GlobalInvocationID\"\n"

			"OpDecorate %id BuiltIn GlobalInvocationId\n"

			"OpDecorate %buf BufferBlock\n"
			"OpDecorate %indata1 DescriptorSet 0\n"
			"OpDecorate %indata1 Binding 0\n"
			"OpDecorate %indata2 DescriptorSet 0\n"
			"OpDecorate %indata2 Binding 1\n"
			"OpDecorate %outdata DescriptorSet 0\n"
			"OpDecorate %outdata Binding 2\n"
			"OpDecorate %i32arr ArrayStride 4\n"
			"OpMemberDecorate %buf 0 Offset 0\n"

			+ string(getComputeAsmCommonTypes()) +

			"%buf        = OpTypeStruct %i32arr\n"
			"%bufptr     = OpTypePointer Uniform %buf\n"
			"%indata1    = OpVariable %bufptr Uniform\n"
			"%indata2    = OpVariable %bufptr Uniform\n"
			"%outdata    = OpVariable %bufptr Uniform\n"

			"%id        = OpVariable %uvec3ptr Input\n"
			"%zero      = OpConstant %i32 0\n"

			"%main      = OpFunction %void None %voidf\n"
			"%label     = OpLabel\n"
			"%idval     = OpLoad %uvec3 %id\n"
			"%x         = OpCompositeExtract %u32 %idval 0\n"
			"%inloc1    = OpAccessChain %i32ptr %indata1 %zero %x\n"
			"%inval1    = OpLoad %i32 %inloc1\n"
			"%inloc2    = OpAccessChain %i32ptr %indata2 %zero %x\n"
			"%inval2    = OpLoad %i32 %inloc2\n"
			"%rem       = OpSRem %i32 %inval1 %inval2\n"
			"%outloc    = OpAccessChain %i32ptr %outdata %zero %x\n"
			"             OpStore %outloc %rem\n"
			"             OpReturn\n"
			"             OpFunctionEnd\n";

		spec.inputs.push_back	(BufferSp(new Int32Buffer(inputInts1)));
		spec.inputs.push_back	(BufferSp(new Int32Buffer(inputInts2)));
		spec.outputs.push_back	(BufferSp(new Int32Buffer(outputInts)));
		spec.numWorkGroups		= IVec3(numElements, 1, 1);
		spec.failResult			= params.failResult;
		spec.failMessage		= params.failMessage;

		group->addChild(new SpvAsmComputeShaderCase(testCtx, params.name, "", spec));
	}

	return group.release();
}